

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

void dill_pbr(dill_stream_conflict s,int op_type,int data_type,dill_reg src1,dill_reg src2,int label
             )

{
  jmp_data *pjVar1;
  int iVar2;
  
  if (5 < (uint)op_type) {
    puts("Bad op type in dill_pbr");
  }
  iVar2 = op_type * 0xb + data_type;
  pjVar1 = s->j->b_data;
  (*s->j->jmp_b[iVar2])(s,(int)pjVar1[iVar2].data1,(int)pjVar1[iVar2].data2,src1,src2,label);
  return;
}

Assistant:

extern void
dill_pbr(dill_stream s,
         int op_type,
         int data_type,
         dill_reg src1,
         dill_reg src2,
         int label)
{
    int index;
    if ((op_type < dill_eq_code) || (op_type > dill_ne_code)) {
        printf("Bad op type in dill_pbr\n");
    }
    index = data_type + 11 * op_type;
    (s->j->jmp_b)[index](s, s->j->b_data[index].data1,
                         s->j->b_data[index].data2, src1, src2, label);
}